

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalPhraseNext(Fts3Cursor *pCsr,Fts3Phrase *p,u8 *pbEof)

{
  Fts3Table *pTab_00;
  Fts3Table *pTab;
  Fts3Doclist *pDL;
  int rc;
  u8 *pbEof_local;
  Fts3Phrase *p_local;
  Fts3Cursor *pCsr_local;
  
  pDL._4_4_ = 0;
  pTab_00 = (Fts3Table *)(pCsr->base).pVtab;
  if (p->bIncr == 0) {
    if ((pCsr->bDesc == pTab_00->bDescIdx) || ((p->doclist).nAll == 0)) {
      fts3EvalDlPhraseNext(pTab_00,&p->doclist,pbEof);
    }
    else {
      sqlite3Fts3DoclistPrev
                ((uint)pTab_00->bDescIdx,(p->doclist).aAll,(p->doclist).nAll,
                 &(p->doclist).pNextDocid,&(p->doclist).iDocid,&(p->doclist).nList,pbEof);
      (p->doclist).pList = (p->doclist).pNextDocid;
    }
  }
  else {
    pDL._4_4_ = fts3EvalIncrPhraseNext(pCsr,p,pbEof);
  }
  return pDL._4_4_;
}

Assistant:

static int fts3EvalPhraseNext(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Phrase *p,                  /* Phrase object to advance to next docid */
  u8 *pbEof                       /* OUT: Set to 1 if EOF */
){
  int rc = SQLITE_OK;
  Fts3Doclist *pDL = &p->doclist;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;

  if( p->bIncr ){
    rc = fts3EvalIncrPhraseNext(pCsr, p, pbEof);
  }else if( pCsr->bDesc!=pTab->bDescIdx && pDL->nAll ){
    sqlite3Fts3DoclistPrev(pTab->bDescIdx, pDL->aAll, pDL->nAll, 
        &pDL->pNextDocid, &pDL->iDocid, &pDL->nList, pbEof
    );
    pDL->pList = pDL->pNextDocid;
  }else{
    fts3EvalDlPhraseNext(pTab, pDL, pbEof);
  }

  return rc;
}